

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yymatchString(GREG *G,char *s)

{
  int iVar1;
  int iVar2;
  char cVar3;
  
  iVar1 = G->pos;
  iVar2 = iVar1;
  while( true ) {
    cVar3 = *s;
    if (cVar3 == '\0') {
      return 1;
    }
    if (G->limit <= iVar2) {
      iVar2 = yyrefill(G);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = G->pos;
      cVar3 = *s;
    }
    if (G->buf[iVar2] != cVar3) break;
    s = s + 1;
    iVar2 = iVar2 + 1;
    G->pos = iVar2;
  }
  G->pos = iVar1;
  return 0;
}

Assistant:

YY_LOCAL(int) yymatchString(GREG *G, const char *s)
{
  int yysav= G->pos;
  while (*s)
    {
      if (G->pos >= G->limit && !yyrefill(G)) return 0;
      if (G->buf[G->pos] != *s)
        {
          G->pos= yysav;
          return 0;
        }
      ++s;
      ++G->pos;
    }
  return 1;
}